

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Validators.hpp
# Opt level: O3

void __thiscall
CLI::IsMember::IsMember<std::vector<char_const*,std::allocator<char_const*>>>
          (IsMember *this,vector<const_char_*,_std::allocator<const_char_*>_> *set,
          filter_fn_t *filter_fn_1,filter_fn_t *filter_fn_2)

{
  vector<const_char_*,_std::allocator<const_char_*>_> local_78;
  _Any_data local_60;
  code *local_50;
  _Any_data local_40;
  code *local_30;
  
  local_78.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_start =
       (set->super__Vector_base<const_char_*,_std::allocator<const_char_*>_>)._M_impl.
       super__Vector_impl_data._M_start;
  local_78.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (set->super__Vector_base<const_char_*,_std::allocator<const_char_*>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  local_78.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (set->super__Vector_base<const_char_*,_std::allocator<const_char_*>_>)._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (set->super__Vector_base<const_char_*,_std::allocator<const_char_*>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (set->super__Vector_base<const_char_*,_std::allocator<const_char_*>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (set->super__Vector_base<const_char_*,_std::allocator<const_char_*>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
  ::function((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
              *)&local_60,filter_fn_1);
  std::
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
  ::function((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
              *)&local_40,filter_fn_2);
  IsMember<std::vector<char_const*,std::allocator<char_const*>>,CLI::IsMember::vector<std::vector<char_const*,std::allocator<char_const*>>>(std::vector<char_const*,std::allocator<char_const*>>&&,std::function<std::__cxx11::string(std::__cxx11::string)>,std::function<std::__cxx11::string(std::__cxx11::string)>)::_lambda(std::__cxx11::string)_1_>
            (this,&local_78,(anon_class_64_2_53a4bb40 *)&local_60);
  if (local_30 != (code *)0x0) {
    (*local_30)(&local_40,&local_40,__destroy_functor);
  }
  if (local_50 != (code *)0x0) {
    (*local_50)(&local_60,&local_60,__destroy_functor);
  }
  if (local_78.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_78.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl
                    .super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

IsMember(T &&set, filter_fn_t filter_fn_1, filter_fn_t filter_fn_2, Args &&...other)
        : IsMember(
              std::forward<T>(set),
              [filter_fn_1, filter_fn_2](std::string a) { return filter_fn_2(filter_fn_1(a)); },
              other...) {}